

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnicodeString.cpp
# Opt level: O3

EStatusCode __thiscall
UnicodeString::FromUTF16LE(UnicodeString *this,uchar *inString,unsigned_long inLength)

{
  ulong uVar1;
  size_t *psVar2;
  ushort uVar3;
  EStatusCode EVar4;
  _List_node_base *p_Var5;
  Trace *this_00;
  char *inFormat;
  ulong uVar6;
  _List_node_base *p_Var7;
  
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::clear
            (&this->mUnicodeCharacters);
  if ((inLength & 1) == 0) {
    uVar6 = 0;
    inFormat = 
    "UnicodeString::FromUTF16LE, fault string - high surrogat encountered without a low surrogate";
    do {
      uVar3 = CONCAT11(inString[uVar6 + 1],inString[uVar6]);
      p_Var7 = (_List_node_base *)(ulong)uVar3;
      if ((inString[uVar6 + 1] & 0xfc) == 0xd8) {
        uVar1 = uVar6 + 2;
        if ((inLength - 1 <= uVar1) || ((inString[uVar6 + 3] & 0xfc) != 0xdc)) goto LAB_001f17bd;
        p_Var7 = (_List_node_base *)
                 (ulong)((uint)uVar3 * 0x400 + (uint)CONCAT11(inString[uVar6 + 3],inString[uVar1]) +
                        0xfca02400);
        uVar6 = uVar1;
      }
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = p_Var7;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar2 = &(this->mUnicodeCharacters).
                super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
                _M_size;
      *psVar2 = *psVar2 + 1;
      uVar6 = uVar6 + 2;
    } while (uVar6 < inLength - 1);
    EVar4 = eSuccess;
  }
  else {
    inFormat = "UnicodeString::FromUTF16LE, invalid UTF16 string, has odd numbers of characters";
LAB_001f17bd:
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,inFormat);
    EVar4 = eFailure;
  }
  return EVar4;
}

Assistant:

EStatusCode UnicodeString::FromUTF16LE(const unsigned char* inString, unsigned long inLength)
{
	mUnicodeCharacters.clear();
	EStatusCode status = PDFHummus::eSuccess;

	if(inLength % 2 != 0)
	{
		TRACE_LOG("UnicodeString::FromUTF16LE, invalid UTF16 string, has odd numbers of characters");
		return PDFHummus::eFailure;
	}

	for(unsigned long i = 0; i < inLength-1 && PDFHummus::eSuccess == status; i+=2)
	{
		unsigned short buffer = (((unsigned short)inString[i+1])<<8) + inString[i];

		if(0xD800 <= buffer && buffer <= 0xDBFF) 
		{
			// Aha! high surrogate! this means that this character requires 2 w_chars
			unsigned short highSurrogate = buffer;
			i+=2;
			if(i>=inLength-1)
			{
				TRACE_LOG("UnicodeString::FromUTF16LE, fault string - high surrogat encountered without a low surrogate");
				status = PDFHummus::eFailure;
				break;
			}

			unsigned short buffer = (((unsigned short)inString[i+1])<<8) + inString[i];
			if(0xDC00 > buffer|| buffer > 0xDFFF)
			{
				TRACE_LOG("UnicodeString::FromUTF16LE, fault string - high surrogat encountered without a low surrogate");
				status = PDFHummus::eFailure;
				break;
			}

			unsigned short lowSurrogate = buffer;

			mUnicodeCharacters.push_back(0x10000 + ((highSurrogate - 0xD800) << 10) + (lowSurrogate - 0xDC00));
		}
		else
			mUnicodeCharacters.push_back(buffer);		
	}

	return status;
}